

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O2

int resist(monst *mtmp,char oclass,int damage,int domsg)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  byte bVar6;
  int iVar7;
  
  bVar6 = oclass - 2;
  if ((bVar6 < 10) && ((0x2d5U >> (bVar6 & 0x1f) & 1) != 0)) {
    iVar4 = *(int *)(&DAT_002c5a5c + (ulong)bVar6 * 4);
  }
  else {
    iVar4 = u.ulevel + 100;
  }
  bVar6 = mtmp->m_lev;
  if (bVar6 < 0x33) {
    uVar3 = (uint)bVar6;
    if (bVar6 == 0) {
      uVar3 = 1;
      if (mtmp->data < (permonst *)((long)&mons[0x168].mname + 1)) {
        uVar3 = u.ulevel;
      }
      if (mtmp->data < mons + 0x159) {
        uVar3 = 1;
      }
    }
  }
  else {
    uVar3 = 0x32;
  }
  iVar4 = rn2(iVar4 - uVar3);
  iVar7 = (int)mtmp->data->mr;
  if (iVar4 < iVar7) {
    if (domsg != 0) {
      shieldeff(mtmp->mx,mtmp->my);
      pcVar5 = Monnam(mtmp);
      pline("%s resists!",pcVar5);
    }
    damage = (damage + 1) / 2;
  }
  if (damage != 0) {
    piVar1 = &mtmp->mhp;
    iVar2 = *piVar1;
    *piVar1 = *piVar1 - damage;
    if (*piVar1 == 0 || SBORROW4(iVar2,damage) != *piVar1 < 0) {
      if (m_using == '\0') {
        killed(mtmp);
      }
      else {
        monkilled(mtmp,"",0xf2);
      }
    }
  }
  return (int)(iVar4 < iVar7);
}

Assistant:

int resist(struct monst *mtmp, char oclass, int damage, int domsg)
{
	int resisted;
	int alev, dlev;

	/* attack level */
	switch (oclass) {
	    case WAND_CLASS:	alev = 12;	 break;
	    case TOOL_CLASS:	alev = 10;	 break;	/* instrument */
	    case WEAPON_CLASS:	alev = 10;	 break;	/* artifact */
	    case SCROLL_CLASS:	alev =  9;	 break;
	    case POTION_CLASS:	alev =  6;	 break;
	    case RING_CLASS:	alev =  5;	 break;
	    default:		alev = u.ulevel; break;	/* spell */
	}
	/* defense level */
	dlev = (int)mtmp->m_lev;
	if (dlev > 50) dlev = 50;
	else if (dlev < 1) dlev = is_mplayer(mtmp->data) ? u.ulevel : 1;

	resisted = rn2(100 + alev - dlev) < mtmp->data->mr;
	if (resisted) {
	    if (domsg) {
		shieldeff(mtmp->mx, mtmp->my);
		pline("%s resists!", Monnam(mtmp));
	    }
	    damage = (damage + 1) / 2;
	}

	if (damage) {
	    mtmp->mhp -= damage;
	    if (mtmp->mhp < 1) {
		if (m_using) monkilled(mtmp, "", AD_RBRE);
		else killed(mtmp);
	    }
	}
	return resisted;
}